

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.h
# Opt level: O0

void __thiscall
cmXMLWriter::Attribute<unsigned_long>(cmXMLWriter *this,char *name,unsigned_long *value)

{
  ostream *poVar1;
  unsigned_long uVar2;
  unsigned_long *value_local;
  char *name_local;
  cmXMLWriter *this_local;
  
  PreAttribute(this);
  poVar1 = std::operator<<(this->Output,name);
  poVar1 = std::operator<<(poVar1,"=\"");
  uVar2 = SafeAttribute<unsigned_long>(*value);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  std::operator<<(poVar1,'\"');
  return;
}

Assistant:

void Attribute(const char* name, T const& value)
  {
    this->PreAttribute();
    this->Output << name << "=\"" << SafeAttribute(value) << '"';
  }